

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-close.c
# Opt level: O0

int run_test_loop_close(void)

{
  int iVar1;
  undefined1 local_360 [8];
  uv_loop_t loop;
  int r;
  
  local_360 = (undefined1  [8])local_360;
  iVar1 = uv_loop_init((uv_loop_t *)local_360);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-close.c"
            ,0x26,"0 == uv_loop_init(&loop)");
    abort();
  }
  if (local_360 != (undefined1  [8])local_360) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-close.c"
            ,0x27,"loop.data == (void*) &loop");
    abort();
  }
  uv_timer_init((uv_loop_t *)local_360,&timer_handle);
  uv_timer_start(&timer_handle,timer_cb,100,100);
  iVar1 = uv_loop_close((uv_loop_t *)local_360);
  if (iVar1 != -0x10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-close.c"
            ,0x2c,"UV_EBUSY == uv_loop_close(&loop)");
    abort();
  }
  uv_run((uv_loop_t *)local_360,UV_RUN_DEFAULT);
  uv_close((uv_handle_t *)&timer_handle,(uv_close_cb)0x0);
  loop._844_4_ = uv_run((uv_loop_t *)local_360,UV_RUN_DEFAULT);
  if (loop._844_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-close.c"
            ,0x32,"r == 0");
    abort();
  }
  if (local_360 != (undefined1  [8])local_360) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-close.c"
            ,0x34,"loop.data == (void*) &loop");
    abort();
  }
  iVar1 = uv_loop_close((uv_loop_t *)local_360);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-close.c"
            ,0x35,"0 == uv_loop_close(&loop)");
    abort();
  }
  if (local_360 != (undefined1  [8])local_360) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-close.c"
            ,0x36,"loop.data == (void*) &loop");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(loop_close) {
  int r;
  uv_loop_t loop;

  loop.data = &loop;
  ASSERT(0 == uv_loop_init(&loop));
  ASSERT(loop.data == (void*) &loop);

  uv_timer_init(&loop, &timer_handle);
  uv_timer_start(&timer_handle, timer_cb, 100, 100);

  ASSERT(UV_EBUSY == uv_loop_close(&loop));

  uv_run(&loop, UV_RUN_DEFAULT);

  uv_close((uv_handle_t*) &timer_handle, NULL);
  r = uv_run(&loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(loop.data == (void*) &loop);
  ASSERT(0 == uv_loop_close(&loop));
  ASSERT(loop.data == (void*) &loop);

  return 0;
}